

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

void co_eventloop(stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg)

{
  stTimeoutItem_t **ppsVar1;
  stTimeoutItemLink_t *psVar2;
  stTimeoutItemLink_t *psVar3;
  epoll_event *peVar4;
  stTimeout_t *psVar5;
  uint uVar6;
  int iVar7;
  co_epoll_res *pcVar8;
  stTimeoutItemLink_t *psVar9;
  stTimeoutItem_t *psVar10;
  stTimeoutItem_t *psVar11;
  stTimeoutItem_t *psVar12;
  ulong allNow;
  ulong uVar13;
  long lVar14;
  timeval local_58;
  void *local_40;
  pfn_co_eventloop_t local_38;
  
  local_40 = arg;
  if (ctx->result == (co_epoll_res *)0x0) {
    pcVar8 = co_epoll_res_alloc(0x2800);
    ctx->result = pcVar8;
  }
  pcVar8 = ctx->result;
  local_38 = pfn;
LAB_00102a90:
  uVar6 = co_epoll_wait(ctx->iEpollFd,pcVar8,0x2800,1);
  psVar2 = ctx->pstTimeoutList;
  psVar3 = ctx->pstActiveList;
  psVar2->head = (stTimeoutItem_t *)0x0;
  psVar2->tail = (stTimeoutItem_t *)0x0;
  if (0 < (int)uVar6) {
    lVar14 = 0;
    do {
      peVar4 = pcVar8->events;
      psVar10 = *(stTimeoutItem_t **)((long)&peVar4->data + lVar14);
      if (psVar10->pfnPrepare == (OnPreparePfn_t)0x0) {
        if (psVar10->pLink == (stTimeoutItemLink_t *)0x0) {
          psVar11 = psVar3->tail;
          if (psVar11 == (stTimeoutItem_t *)0x0) {
            psVar3->tail = psVar10;
            psVar3->head = psVar10;
            psVar10->pPrev = (stTimeoutItem_t *)0x0;
            psVar10->pNext = (stTimeoutItem_t *)0x0;
          }
          else {
            psVar11->pNext = psVar10;
            psVar10->pNext = (stTimeoutItem_t *)0x0;
            psVar10->pPrev = psVar11;
            psVar3->tail = psVar10;
          }
          psVar10->pLink = psVar3;
        }
      }
      else {
        (*psVar10->pfnPrepare)(psVar10,(epoll_event *)((long)&peVar4->events + lVar14),psVar3);
      }
      lVar14 = lVar14 + 0xc;
    } while ((ulong)uVar6 * 0xc != lVar14);
  }
  local_58.tv_sec = 0;
  local_58.tv_usec = 0;
  gettimeofday(&local_58,(__timezone_ptr_t)0x0);
  allNow = local_58.tv_usec / 1000 + local_58.tv_sec * 1000;
  psVar5 = ctx->pTimeout;
  if (psVar5->ullStart == 0) {
    psVar5->ullStart = allNow;
    psVar5->llStartIdx = 0;
  }
  if (psVar5->ullStart <= allNow) {
    uVar6 = ((int)allNow - (int)psVar5->ullStart) + 1;
    if (psVar5->iItemSize <= (int)uVar6) {
      uVar6 = psVar5->iItemSize;
    }
    if (-1 < (int)uVar6) {
      if (uVar6 != 0) {
        uVar13 = 0;
        do {
          lVar14 = (long)(psVar5->llStartIdx + uVar13) % (long)psVar5->iItemSize;
          psVar10 = psVar5->pItems[lVar14].head;
          if (psVar10 != (stTimeoutItem_t *)0x0) {
            psVar9 = psVar5->pItems + lVar14;
            psVar11 = psVar10;
            do {
              psVar11->pLink = psVar2;
              psVar11 = psVar11->pNext;
            } while (psVar11 != (stTimeoutItem_t *)0x0);
            psVar11 = psVar2->tail;
            if (psVar11 == (stTimeoutItem_t *)0x0) {
              psVar2->head = psVar10;
            }
            else {
              psVar11->pNext = psVar10;
              psVar10->pPrev = psVar11;
            }
            psVar2->tail = psVar9->tail;
            psVar9->head = (stTimeoutItem_t *)0x0;
            psVar9->tail = (stTimeoutItem_t *)0x0;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar6);
      }
      psVar5->ullStart = allNow;
      psVar5->llStartIdx = (long)(int)uVar6 + psVar5->llStartIdx + -1;
    }
  }
  for (psVar10 = psVar2->head; psVar10 != (stTimeoutItem_t *)0x0; psVar10 = psVar10->pNext) {
    psVar10->bTimeout = true;
  }
  psVar10 = psVar2->head;
  psVar11 = psVar10;
  if (psVar10 != (stTimeoutItem_t *)0x0) {
    do {
      psVar11->pLink = psVar3;
      ppsVar1 = &psVar11->pNext;
      psVar11 = *ppsVar1;
    } while (*ppsVar1 != (stTimeoutItem_t *)0x0);
    psVar11 = psVar3->tail;
    if (psVar11 == (stTimeoutItem_t *)0x0) {
      psVar3->head = psVar10;
    }
    else {
      psVar11->pNext = psVar10;
      psVar10->pPrev = psVar11;
    }
    psVar3->tail = psVar2->tail;
    psVar2->head = (stTimeoutItem_t *)0x0;
    psVar2->tail = (stTimeoutItem_t *)0x0;
  }
  do {
    psVar10 = psVar3->head;
    while( true ) {
      if (psVar10 == (stTimeoutItem_t *)0x0) {
        if ((local_38 != (pfn_co_eventloop_t)0x0) && (iVar7 = (*local_38)(local_40), iVar7 == -1)) {
          return;
        }
        goto LAB_00102a90;
      }
      psVar11 = psVar3->head;
      if (psVar11 != (stTimeoutItem_t *)0x0) {
        if (psVar11 == psVar3->tail) {
          psVar3->tail = (stTimeoutItem_t *)0x0;
          psVar12 = (stTimeoutItem_t *)0x0;
        }
        else {
          psVar12 = psVar11->pNext;
        }
        psVar3->head = psVar12;
        psVar11->pPrev = (stTimeoutItem_t *)0x0;
        psVar11->pNext = (stTimeoutItem_t *)0x0;
        psVar11->pLink = (stTimeoutItemLink_t *)0x0;
        if (psVar12 != (stTimeoutItem_t *)0x0) {
          psVar12->pPrev = (stTimeoutItem_t *)0x0;
        }
      }
      if (((psVar10->bTimeout != true) || (psVar10->ullExpireTime <= allNow)) ||
         (iVar7 = AddTimeout(ctx->pTimeout,psVar10,allNow), iVar7 != 0)) break;
      psVar10->bTimeout = false;
      psVar10 = psVar3->head;
    }
    if (psVar10->pfnProcess != (OnProcessPfn_t)0x0) {
      (*psVar10->pfnProcess)(psVar10);
    }
  } while( true );
}

Assistant:

void co_eventloop( stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg )
{
	if( !ctx->result )
	{
		ctx->result =  co_epoll_res_alloc( stCoEpoll_t::_EPOLL_SIZE );
	}
	co_epoll_res *result = ctx->result;


	for(;;)
	{
		int ret = co_epoll_wait( ctx->iEpollFd,result,stCoEpoll_t::_EPOLL_SIZE, 1 );

		stTimeoutItemLink_t *active = (ctx->pstActiveList);
		stTimeoutItemLink_t *timeout = (ctx->pstTimeoutList);

		memset( timeout,0,sizeof(stTimeoutItemLink_t) );

		for(int i=0;i<ret;i++)
		{
			stTimeoutItem_t *item = (stTimeoutItem_t*)result->events[i].data.ptr;
			if( item->pfnPrepare )
			{
				item->pfnPrepare( item,result->events[i],active );
			}
			else
			{
				AddTail( active,item );
			}
		}


		unsigned long long now = GetTickMS();
		TakeAllTimeout( ctx->pTimeout,now,timeout );

		stTimeoutItem_t *lp = timeout->head;
		while( lp )
		{
			//printf("raise timeout %p\n",lp);
			lp->bTimeout = true;
			lp = lp->pNext;
		}

		Join<stTimeoutItem_t,stTimeoutItemLink_t>( active,timeout );

		lp = active->head;
		while( lp )
		{

			PopHead<stTimeoutItem_t,stTimeoutItemLink_t>( active );
            if (lp->bTimeout && now < lp->ullExpireTime) 
			{
				int ret = AddTimeout(ctx->pTimeout, lp, now);
				if (!ret) 
				{
					lp->bTimeout = false;
					lp = active->head;
					continue;
				}
			}
			if( lp->pfnProcess )
			{
				lp->pfnProcess( lp );
			}

			lp = active->head;
		}
		if( pfn )
		{
			if( -1 == pfn( arg ) )
			{
				break;
			}
		}

	}
}